

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

int FirewirePort::reset_handler(raw1394handle_t hdl,uint gen)

{
  uint uVar1;
  bool bVar2;
  reference ppFVar3;
  void *this;
  ostream *poVar4;
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  local_40;
  FirewirePort **local_38;
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  local_30;
  FirewirePort **local_28;
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  local_20;
  iterator it;
  int ret;
  uint gen_local;
  raw1394handle_t hdl_local;
  
  it._M_current._0_4_ = 0;
  it._M_current._4_4_ = gen;
  __gnu_cxx::
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  ::__normal_iterator(&local_20);
  local_28 = (FirewirePort **)
             std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::begin(&PortList);
  local_20._M_current = local_28;
  do {
    local_30._M_current =
         (FirewirePort **)
         std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::end(&PortList);
    bVar2 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar2) {
LAB_0011c2a9:
      local_40._M_current =
           (FirewirePort **)
           std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::end(&PortList);
      bVar2 = __gnu_cxx::operator==(&local_20,&local_40);
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "FirewirePort::reset_handler: could not find port");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      return (int)it._M_current;
    }
    ppFVar3 = __gnu_cxx::
              __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
              ::operator*(&local_20);
    if ((*ppFVar3)->handle == hdl) {
      ppFVar3 = __gnu_cxx::
                __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
                ::operator*(&local_20);
      poVar4 = std::operator<<(((*ppFVar3)->super_BasePort).outStr,
                               "FirewirePort::reset_handler: generation = ");
      this = (void *)std::ostream::operator<<(poVar4,it._M_current._4_4_);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      uVar1 = it._M_current._4_4_;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
                ::operator*(&local_20);
      ((*ppFVar3)->super_BasePort).newFwBusGeneration = uVar1;
      goto LAB_0011c2a9;
    }
    local_38 = (FirewirePort **)
               __gnu_cxx::
               __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
               ::operator++(&local_20,0);
  } while( true );
}

Assistant:

int FirewirePort::reset_handler(raw1394handle_t hdl, uint gen)
{
    int ret = 0;
    PortListType::iterator it;
    for (it = PortList.begin(); it != PortList.end(); it++) {
        if ((*it)->handle == hdl) {
            (*it)->outStr << "FirewirePort::reset_handler: generation = " << gen << std::endl;
            // Call default handler, which calls raw1394_update_generation
            // ret = (*it)->old_reset_handler(hdl, gen);
            (*it)->newFwBusGeneration = gen;
            break;
        }
    }
    if (it == PortList.end())
        std::cerr << "FirewirePort::reset_handler: could not find port" << std::endl;
    return ret;
}